

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O3

string * gimage::getNewImageName(string *__return_storage_ptr__,string *prefix)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  ImageIO *pIVar5;
  ostream *poVar6;
  uint uVar7;
  string *name;
  string suffix;
  ifstream file;
  ostringstream out;
  char *local_3f8;
  char *local_3f0;
  char local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  char *local_3d0 [2];
  char local_3c0 [16];
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [504];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_3f8 = local_3e8;
  local_3f0 = (char *)0x0;
  local_3e8[0] = '\0';
  lVar4 = std::__cxx11::string::rfind((char)prefix,0x2e);
  if ((lVar4 != -1) && (prefix->_M_string_length - lVar4 < 5)) {
    std::__cxx11::string::substr((ulong)local_3b0,(ulong)prefix);
    std::__cxx11::string::operator=((string *)&local_3f8,(string *)local_3b0);
    if (local_3b0[0] != local_3a0) {
      operator_delete(local_3b0[0]);
    }
    std::__cxx11::string::substr((ulong)local_3b0,(ulong)prefix);
    std::__cxx11::string::operator=((string *)prefix,(string *)local_3b0);
    if (local_3b0[0] != local_3a0) {
      operator_delete(local_3b0[0]);
    }
  }
  if (local_3f0 == (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_3f8,0,(char *)0x0,0x15098f);
    pIVar5 = getImageIO();
    bVar2 = ImageIO::handlesFile(pIVar5,"file.png",false);
    if (bVar2) {
      pcVar1 = "file.png";
    }
    else {
      pIVar5 = getImageIO();
      bVar2 = ImageIO::handlesFile(pIVar5,"file.tif",false);
      if (!bVar2) goto LAB_0013565f;
      pcVar1 = "file.tif";
    }
    std::__cxx11::string::_M_replace((ulong)&local_3f8,0,local_3f0,(ulong)(pcVar1 + 4));
  }
LAB_0013565f:
  local_3d8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_3d8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar7 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_",1);
    if (uVar7 < 100) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0",1);
      if (uVar7 < 10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0",1);
      }
    }
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3f8,(long)local_3f0);
    std::__cxx11::stringbuf::str();
    std::ifstream::ifstream(local_3b0,local_3d0[0],_S_in);
    if (local_3d0[0] != local_3c0) {
      operator_delete(local_3d0[0]);
    }
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_3d0);
      if (local_3d0[0] != local_3c0) {
        operator_delete(local_3d0[0]);
      }
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_3b0);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  } while ((__return_storage_ptr__->_M_string_length == 0) &&
          (bVar2 = uVar7 < 999, uVar7 = uVar7 + 1, bVar2));
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getNewImageName(std::string prefix)
{
  // try getting existing suffix

  std::string suffix;

  size_t i=prefix.rfind('.');

  if (i != prefix.npos && prefix.size()-i <= 4)
  {
    suffix=prefix.substr(i);
    prefix=prefix.substr(0, i);
  }

  // determine supported format for writing image

  if (suffix.size() == 0)
  {
    suffix=".ppm";

    if (getImageIO().handlesFile("file.png", false))
    {
      suffix=".png";
    }
    else if (getImageIO().handlesFile("file.tif", false))
    {
      suffix=".tif";
    }
  }

  // find file name that is not used

  int c=0;
  std::string name;

  while (name.size() == 0 && c < 1000)
  {
    std::ostringstream out;
    out << prefix << "_";

    if (c < 100)
    {
      out << "0";
    }

    if (c < 10)
    {
      out << "0";
    }

    out << c++ << suffix;

    std::ifstream file(out.str().c_str());

    if (!file.is_open())
    {
      name=out.str();
    }

    file.close();
  }

  return name;
}